

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFUnitHeader::extract
          (DWARFUnitHeader *this,DWARFContext *Context,DWARFDataExtractor *debug_info,
          uint64_t *offset_ptr,DWARFSectionKind SectionKind,DWARFUnitIndex *Index,Entry *Entry)

{
  DwarfFormat DVar1;
  ushort uVar2;
  uint8_t uVar3;
  bool bVar4;
  uint16_t uVar5;
  Entry *pEVar6;
  uint64_t uVar7;
  SectionContribution *pSVar8;
  ulong uVar9;
  long lVar10;
  uint32_t uVar11;
  bool bVar12;
  
  this->Offset = *offset_ptr;
  this->IndexEntry = Entry;
  if (Index != (DWARFUnitIndex *)0x0 && Entry == (Entry *)0x0) {
    pEVar6 = DWARFUnitIndex::getFromOffset(Index,(uint32_t)*offset_ptr);
    this->IndexEntry = pEVar6;
  }
  uVar7 = DWARFDataExtractor::getRelocatedValue
                    (debug_info,4,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
  this->Length = uVar7;
  (this->FormParams).Format = DWARF32;
  if (uVar7 == 0xffffffff) {
    uVar7 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    this->Length = uVar7;
    (this->FormParams).Format = DWARF64;
  }
  uVar5 = DataExtractor::getU16(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
  (this->FormParams).Version = uVar5;
  if (uVar5 < 5) {
    DVar1 = (this->FormParams).Format;
    uVar11 = 4;
    if (DVar1 != DWARF32) {
      if (DVar1 != DWARF64) goto LAB_00d8f794;
      uVar11 = 8;
    }
    uVar7 = DWARFDataExtractor::getRelocatedValue
                      (debug_info,uVar11,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
    this->AbbrOffset = uVar7;
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    (this->FormParams).AddrSize = uVar3;
    if (SectionKind == DW_SECT_TYPES) {
      this->UnitType = '\x02';
    }
    else {
      this->UnitType = '\x01';
    }
  }
  else {
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    this->UnitType = uVar3;
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    (this->FormParams).AddrSize = uVar3;
    DVar1 = (this->FormParams).Format;
    uVar11 = 4;
    if (DVar1 != DWARF32) {
      if (DVar1 != DWARF64) goto LAB_00d8f794;
      uVar11 = 8;
    }
    uVar7 = DWARFDataExtractor::getRelocatedValue
                      (debug_info,uVar11,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
    this->AbbrOffset = uVar7;
  }
  if (this->IndexEntry == (Entry *)0x0) {
LAB_00d8f666:
    if ((this->UnitType & 0xfb) == 2) {
      uVar7 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
      this->TypeHash = uVar7;
      DVar1 = (this->FormParams).Format;
      uVar11 = 4;
      if (DVar1 != DWARF32) {
        if (DVar1 != DWARF64) {
LAB_00d8f794:
          llvm_unreachable_internal
                    ("Invalid Format value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                     ,0x230);
        }
        uVar11 = 8;
      }
      uVar7 = DataExtractor::getUnsigned
                        (&debug_info->super_DataExtractor,offset_ptr,uVar11,(Error *)0x0);
      this->TypeOffset = uVar7;
    }
    else if ((this->UnitType & 0xfe) == 4) {
      uVar7 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
      (this->DWOId).Storage.field_0.value = uVar7;
      if ((this->DWOId).Storage.hasVal == false) {
        (this->DWOId).Storage.hasVal = true;
      }
    }
    uVar9 = *offset_ptr - this->Offset;
    if (0xff < uVar9) {
      __assert_fail("*offset_ptr - Offset <= 255 && \"unexpected header size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                    ,0x11c,
                    "bool llvm::DWARFUnitHeader::extract(DWARFContext &, const DWARFDataExtractor &, uint64_t *, DWARFSectionKind, const DWARFUnitIndex *, const DWARFUnitIndex::Entry *)"
                   );
    }
    this->Size = (uint8_t)uVar9;
    if ((this->UnitType & 0xfb) == 2) {
      bVar12 = true;
      if (uVar9 <= this->TypeOffset) {
        DVar1 = (this->FormParams).Format;
        lVar10 = 4;
        if (DVar1 != DWARF32) {
          if (DVar1 != DWARF64) {
            llvm_unreachable_internal
                      ("Invalid Format value",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                       ,0x23e);
          }
          lVar10 = 0xc;
        }
        bVar12 = lVar10 + this->Length <= this->TypeOffset;
      }
    }
    else {
      bVar12 = false;
    }
    uVar7 = getNextUnitOffset(this);
    bVar4 = false;
    if ((((!bVar12) && (((this->FormParams).AddrSize - 4 & 0xfb) == 0)) &&
        (bVar4 = false, uVar7 - 1 < (debug_info->super_DataExtractor).Data.Length)) &&
       (uVar2 = (this->FormParams).Version, 0xfffffffb < uVar2 - 6)) {
      bVar4 = true;
      if (Context->MaxVersion < (uint)uVar2) {
        Context->MaxVersion = (uint)uVar2;
      }
    }
  }
  else {
    if (this->AbbrOffset == 0) {
      pSVar8 = DWARFUnitIndex::Entry::getOffset(this->IndexEntry);
      if ((pSVar8 != (SectionContribution *)0x0) && (this->Length + 4 == (ulong)pSVar8->Length)) {
        pSVar8 = DWARFUnitIndex::Entry::getOffset(this->IndexEntry,DW_SECT_ABBREV);
        if (pSVar8 != (SectionContribution *)0x0) {
          this->AbbrOffset = (ulong)pSVar8->Offset;
          goto LAB_00d8f666;
        }
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DWARFUnitHeader::extract(DWARFContext &Context,
                              const DWARFDataExtractor &debug_info,
                              uint64_t *offset_ptr,
                              DWARFSectionKind SectionKind,
                              const DWARFUnitIndex *Index,
                              const DWARFUnitIndex::Entry *Entry) {
  Offset = *offset_ptr;
  IndexEntry = Entry;
  if (!IndexEntry && Index)
    IndexEntry = Index->getFromOffset(*offset_ptr);
  Length = debug_info.getRelocatedValue(4, offset_ptr);
  FormParams.Format = DWARF32;
  if (Length == dwarf::DW_LENGTH_DWARF64) {
    Length = debug_info.getU64(offset_ptr);
    FormParams.Format = DWARF64;
  }
  FormParams.Version = debug_info.getU16(offset_ptr);
  if (FormParams.Version >= 5) {
    UnitType = debug_info.getU8(offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
  } else {
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    // Fake a unit type based on the section type.  This isn't perfect,
    // but distinguishing compile and type units is generally enough.
    if (SectionKind == DW_SECT_TYPES)
      UnitType = DW_UT_type;
    else
      UnitType = DW_UT_compile;
  }
  if (IndexEntry) {
    if (AbbrOffset)
      return false;
    auto *UnitContrib = IndexEntry->getOffset();
    if (!UnitContrib || UnitContrib->Length != (Length + 4))
      return false;
    auto *AbbrEntry = IndexEntry->getOffset(DW_SECT_ABBREV);
    if (!AbbrEntry)
      return false;
    AbbrOffset = AbbrEntry->Offset;
  }
  if (isTypeUnit()) {
    TypeHash = debug_info.getU64(offset_ptr);
    TypeOffset =
        debug_info.getUnsigned(offset_ptr, FormParams.getDwarfOffsetByteSize());
  } else if (UnitType == DW_UT_split_compile || UnitType == DW_UT_skeleton)
    DWOId = debug_info.getU64(offset_ptr);

  // Header fields all parsed, capture the size of this unit header.
  assert(*offset_ptr - Offset <= 255 && "unexpected header size");
  Size = uint8_t(*offset_ptr - Offset);

  // Type offset is unit-relative; should be after the header and before
  // the end of the current unit.
  bool TypeOffsetOK =
      !isTypeUnit()
          ? true
          : TypeOffset >= Size &&
                TypeOffset < getLength() + getUnitLengthFieldByteSize();
  bool LengthOK = debug_info.isValidOffset(getNextUnitOffset() - 1);
  bool VersionOK = DWARFContext::isSupportedVersion(getVersion());
  bool AddrSizeOK = getAddressByteSize() == 4 || getAddressByteSize() == 8;

  if (!LengthOK || !VersionOK || !AddrSizeOK || !TypeOffsetOK)
    return false;

  // Keep track of the highest DWARF version we encounter across all units.
  Context.setMaxVersionIfGreater(getVersion());
  return true;
}